

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
push_back_new_elem_w_storage_increase_copy
          (vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *this,
          vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *v)

{
  elem_ptr_const_pointer _free;
  my_base *a;
  elem_ptr_pointer dst_ptr;
  elem_ptr_pointer begin;
  elem_ptr_pointer __x;
  size_type sVar1;
  vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
  *end;
  poly_copy_descr local_38;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *local_20;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *v_local;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *this_local;
  
  local_20 = v;
  v_local = this;
  a = base(v);
  dst_ptr = begin_elem(local_20);
  begin = begin_elem(this);
  _free = this->_free_elem;
  __x = begin_elem(this);
  sVar1 = capacity(local_20);
  end = std::
        next<poly::vector_elem_ptr<poly::virtual_cloning_policy,std::allocator_traits<std::allocator<Interface>>>*>
                  (__x,sVar1);
  sVar1 = max_align(local_20);
  poly_uninitialized_copy(&local_38,a,dst_ptr,begin,_free,end,sVar1);
  set_ptrs(v,&local_38);
  return;
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase_copy(
    vector& v, std::false_type /*unused*/)
{
    v.set_ptrs(poly_uninitialized_copy(v.base(), v.begin_elem(), begin_elem(), _free_elem,
        std::next(begin_elem(), v.capacity()), v.max_align()));
}